

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t pem2der(char *pem,size_t len,uchar *out)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar1 = strstr(pem,"-----BEGIN");
  pcVar2 = strstr(pem,"-----END");
  if (pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0) {
    pcVar8 = pem + len;
    pcVar7 = pcVar1 + (9 - (long)pcVar2);
    for (pcVar1 = pcVar1 + 10; (pcVar1 < pcVar8 && (*pcVar1 != '-')); pcVar1 = pcVar1 + 1) {
      pcVar7 = pcVar7 + 1;
    }
    do {
      pcVar4 = pcVar1;
      pcVar1 = pcVar4 + 1;
      pcVar7 = pcVar7 + 1;
      if (pcVar8 <= pcVar4) break;
    } while (*pcVar4 == '-');
    uVar6 = (ulong)(*pcVar4 == '\r');
    lVar5 = (pcVar4[uVar6] == '\n') + uVar6;
    if (pcVar2 <= pcVar8 && pcVar1 + lVar5 + -1 < pcVar2) {
      sVar3 = base64_decode(pcVar1 + lVar5 + -1,-(long)(pcVar7 + lVar5),out);
      return sVar3;
    }
  }
  return 0;
}

Assistant:

size_t pem2der(const char* pem, size_t len, unsigned char* out)
{
	const char* end = pem + len;
	const char* s1 = strstr(pem, "-----BEGIN");
	const char* s2 = strstr(pem, "-----END");

	if(s1 == NULL)
		return 0;

	if(s2 == NULL)
		return 0;

	s1 += 10;

	while(s1 < end && *s1 != '-')
		s1++;

	while(s1 < end && *s1 == '-')
		s1++;

	if(*s1 == '\r') s1++;
	if(*s1 == '\n') s1++;

	if(s2 <= s1 || s2 > end)
		return 0;

	return base64_decode(s1, (size_t)(s2 - s1), (unsigned char*)out);
}